

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O3

void __thiscall cmStringReplaceHelper::ParseReplaceExpression(cmStringReplaceHelper *this)

{
  string *psVar1;
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  *this_00;
  byte bVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  char (*__args) [2];
  ostringstream error;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->ReplaceExpression)._M_string_length != 0) {
    psVar1 = &this->ReplaceExpression;
    this_00 = &this->Replacements;
    uVar5 = 0;
    do {
      uVar3 = std::__cxx11::string::find((char)psVar1,0x5c);
      if (uVar3 == 0xffffffffffffffff) {
        uVar5 = (this->ReplaceExpression)._M_string_length;
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar1);
        std::
        vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
        ::emplace_back<std::__cxx11::string>
                  ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                          local_1a8._16_8_ + 1);
        }
      }
      else {
        if (uVar3 != uVar5) {
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)psVar1);
          std::
          vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
          ::emplace_back<std::__cxx11::string>
                    ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
          ;
          if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                            local_1a8._16_8_ + 1);
          }
        }
        if (uVar3 == (this->ReplaceExpression)._M_string_length - 1) {
          this->ValidReplaceExpression = false;
          std::__cxx11::string::_M_replace
                    ((ulong)this,0,(char *)(this->ErrorString)._M_string_length,0x554a5c);
          return;
        }
        bVar2 = (psVar1->_M_dataplus)._M_p[uVar3 + 1];
        if ((char)bVar2 < 0x30) {
LAB_00299b2e:
          this->ValidReplaceExpression = false;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unknown escape \"",0x10);
          std::__cxx11::string::substr((ulong)&local_1c8,(ulong)psVar1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_1c8,local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" in replace-expression",0x17)
          ;
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)this,(string *)&local_1c8);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          return;
        }
        if (bVar2 < 0x3a) {
          local_1a8._0_4_ = (char)bVar2 + -0x30;
          std::
          vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
          ::emplace_back<int>(this_00,(int *)local_1a8);
        }
        else {
          if (bVar2 == 0x5c) {
            __args = (char (*) [2])0x55b218;
          }
          else {
            if (bVar2 != 0x6e) goto LAB_00299b2e;
            __args = (char (*) [2])0x594e49;
          }
          std::
          vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
          ::emplace_back<char_const(&)[2]>
                    ((vector<cmStringReplaceHelper::RegexReplacement,std::allocator<cmStringReplaceHelper::RegexReplacement>>
                      *)this_00,__args);
        }
        uVar5 = uVar3 + 2;
      }
    } while (uVar5 < (this->ReplaceExpression)._M_string_length);
  }
  return;
}

Assistant:

void cmStringReplaceHelper::ParseReplaceExpression()
{
  std::string::size_type l = 0;
  while (l < this->ReplaceExpression.length()) {
    auto r = this->ReplaceExpression.find('\\', l);
    if (r == std::string::npos) {
      r = this->ReplaceExpression.length();
      this->Replacements.emplace_back(
        this->ReplaceExpression.substr(l, r - l));
    } else {
      if (r - l > 0) {
        this->Replacements.emplace_back(
          this->ReplaceExpression.substr(l, r - l));
      }
      if (r == (this->ReplaceExpression.length() - 1)) {
        this->ValidReplaceExpression = false;
        this->ErrorString = "replace-expression ends in a backslash";
        return;
      }
      if ((this->ReplaceExpression[r + 1] >= '0') &&
          (this->ReplaceExpression[r + 1] <= '9')) {
        this->Replacements.emplace_back(this->ReplaceExpression[r + 1] - '0');
      } else if (this->ReplaceExpression[r + 1] == 'n') {
        this->Replacements.emplace_back("\n");
      } else if (this->ReplaceExpression[r + 1] == '\\') {
        this->Replacements.emplace_back("\\");
      } else {
        this->ValidReplaceExpression = false;
        std::ostringstream error;
        error << "Unknown escape \"" << this->ReplaceExpression.substr(r, 2)
              << "\" in replace-expression";
        this->ErrorString = error.str();
        return;
      }
      r += 2;
    }
    l = r;
  }
}